

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

void __thiscall
libtorrent::picker_log_alert::picker_log_alert
          (picker_log_alert *this,stack_allocator *alloc,torrent_handle *h,endpoint *ep,
          peer_id *peer_id,picker_flags_t flags,span<const_libtorrent::piece_block> blocks)

{
  allocation_slot aVar1;
  span<const_char> buf;
  
  peer_alert::peer_alert(&this->super_peer_alert,alloc,h,ep,peer_id);
  (this->super_peer_alert).super_torrent_alert.super_alert._vptr_alert =
       (_func_int **)&PTR__torrent_alert_00432068;
  *(uint *)&(this->super_peer_alert).field_0x9c = flags.m_val;
  buf.m_len = blocks.m_len * 8;
  buf.m_ptr = (char *)blocks.m_ptr;
  aVar1 = aux::stack_allocator::copy_buffer(alloc,buf);
  (this->m_array_idx).m_idx = aVar1.m_idx;
  this->m_num_blocks = (int)blocks.m_len;
  return;
}

Assistant:

picker_log_alert::picker_log_alert(aux::stack_allocator& alloc, torrent_handle const& h
		, tcp::endpoint const& ep, peer_id const& peer_id, picker_flags_t const flags
		, span<piece_block const> blocks)
		: peer_alert(alloc, h, ep, peer_id)
		, picker_flags(flags)
		, m_array_idx(alloc.copy_buffer({reinterpret_cast<char const*>(blocks.data())
			, blocks.size() * int(sizeof(piece_block))}))
		, m_num_blocks(int(blocks.size()))
	{}